

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

bool __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::
FindHeapObjectImpl<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,void *objectAddress,
          Recycler *recycler,FindHeapObjectFlags flags,RecyclerHeapObjectInfo *heapObject)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  ushort uVar4;
  uint uVar5;
  BOOL BVar6;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *pSVar7;
  byte *pbVar8;
  undefined4 *puVar9;
  SmallHeapBlockBitVector *this_00;
  uint local_34;
  
  if (((flags & FindHeapObjectFlags_AllowInterior) == FindHeapObjectFlags_NoFlags) ||
     (objectAddress = GetRealAddressFromInterior(this,objectAddress),
     (byte *)objectAddress != (byte *)0x0)) {
    uVar4 = GetAddressIndex(this,objectAddress);
    if (uVar4 != 0xffff) {
      if (((flags & FindHeapObjectFlags_NoFreeBitVerify) == FindHeapObjectFlags_NoFlags) &&
         ((((flags & FindHeapObjectFlags_VerifyFreeBitForAttribute) == FindHeapObjectFlags_NoFlags
           || (((uVar5 = (uint)(this->super_HeapBlock).heapBlockType, uVar5 < 0xb &&
                ((0x528U >> (uVar5 & 0x1f) & 1) != 0)) &&
               (pSVar7 = HeapBlock::AsFinalizableBlock<SmallAllocationBlockAttributes>
                                   (&this->super_HeapBlock), pSVar7->pendingDisposeCount != 0)))) &&
          (BVar6 = Recycler::IsConcurrentSweepExecutingState(recycler), BVar6 == 0)))) {
        if ((flags & FindHeapObjectFlags_ClearedAllocators) == FindHeapObjectFlags_NoFlags) {
          if (this->isInAllocator == true) {
            HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
            UpdateAllocators((HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                              *)this->heapBucket);
          }
        }
        else {
          bVar2 = HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                  ::AllocatorsAreEmpty
                            ((HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                              *)this->heapBucket);
          if ((!bVar2) && (recycler->isHeapEnumInProgress == false)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar9 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                               ,0x28d,
                               "(((HeapBucketT<TBlockType> *)this->heapBucket)->AllocatorsAreEmpty() || recycler->isHeapEnumInProgress)"
                               ,
                               "((HeapBucketT<TBlockType> *)this->heapBucket)->AllocatorsAreEmpty() || recycler->isHeapEnumInProgress"
                              );
            if (!bVar2) goto LAB_006ba37d;
            *puVar9 = 0;
          }
        }
        this_00 = EnsureFreeBitVector(this,true);
        local_34 = (uint)uVar4;
        BVar3 = BVStatic<256UL>::Test(this_00,(this->objectSize >> 4) * local_34);
        if (BVar3 != '\0') {
          return false;
        }
      }
      pbVar8 = ObjectInfo(this,(uint)uVar4);
      heapObject->m_address = objectAddress;
      heapObject->m_recycler = recycler;
      heapObject->m_heapBlock = &this->super_HeapBlock;
      (heapObject->field_3).m_attributes = pbVar8;
      heapObject->isUsingLargeHeapBlock = false;
      return true;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x272,"(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)",
                       "index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit");
    if (!bVar2) {
LAB_006ba37d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar9 = 0;
  }
  return false;
}

Assistant:

bool
SmallHeapBlockT<TBlockAttributes>::FindHeapObjectImpl(void* objectAddress, Recycler * recycler, FindHeapObjectFlags flags, RecyclerHeapObjectInfo& heapObject)
{
    if (flags & FindHeapObjectFlags_AllowInterior)
    {
        objectAddress = (void*) this->GetRealAddressFromInterior(objectAddress);
        if (objectAddress == nullptr)
        {
            return false;
        }
    }

    ushort index = GetAddressIndex(objectAddress);
    Assert(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit);

    if (index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)
    {
        return false;
    }

    // If we have pending object, we still need to check the free bit if the caller requested the attribute to be correct
    bool const disableCheck = ((flags & FindHeapObjectFlags_NoFreeBitVerify) != 0) ||
        ((flags & FindHeapObjectFlags_VerifyFreeBitForAttribute) != 0 && !this->HasPendingDisposeObjects());
    if (!disableCheck)
    {
        // REVIEW: Checking if an object if free is strictly not necessary
        // In all case, we should have a valid object, For memory protect heap, this is just to make sure we don't
        // free pointers that are invalid.
#if ENABLE_CONCURRENT_GC
        if (recycler->IsConcurrentSweepExecutingState())
        {
            // TODO: unless we know the state of the heap block, we don't know.
            // skip the check for now.
        }
        else
#endif
        {
            if (flags & FindHeapObjectFlags_ClearedAllocators)
            {
                // Heap enum has some case where it allocates, so we can't assert
                Assert(((HeapBucketT<TBlockType> *)this->heapBucket)->AllocatorsAreEmpty() || recycler->isHeapEnumInProgress);
            }
            else if (this->IsInAllocator())
            {
                ((HeapBucketT<TBlockType> *)this->heapBucket)->UpdateAllocators();
            }

            // REVIEW allocation heuristics
            if (this->EnsureFreeBitVector()->Test(this->GetObjectBitDelta() * index))
            {
                return false;
            }
        }
    }

    byte& attributes = ObjectInfo(index);
    heapObject = RecyclerHeapObjectInfo(objectAddress, recycler, this, &attributes);
    return true;
}